

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O2

bool tinyusdz::ACEScg_to_linear_sRGB
               (vector<float,_std::allocator<float>_> *in_img,size_t width,size_t height,
               size_t channels,vector<float,_std::allocator<float>_> *out_img,string *err)

{
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  ostream *poVar5;
  pointer pfVar6;
  pointer pfVar7;
  pointer pcVar8;
  pointer __new_size;
  size_t sVar9;
  char *pcVar10;
  long lVar11;
  size_t sVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ostringstream ss_e;
  allocator local_209;
  string *local_208;
  undefined1 local_200 [40];
  size_t local_1d8;
  unsigned_long local_1d0;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  local_1d8 = channels;
  if (width == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar5 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ACEScg_to_linear_sRGB");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x3a2);
    ::std::operator<<(poVar5," ");
    pcVar10 = "width is zero.";
  }
  else if (height == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar5 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ACEScg_to_linear_sRGB");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x3a6);
    ::std::operator<<(poVar5," ");
    pcVar10 = "height is zero.";
  }
  else if (channels == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar5 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ACEScg_to_linear_sRGB");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x3aa);
    ::std::operator<<(poVar5," ");
    pcVar10 = "channels is zero.";
  }
  else {
    if (channels - 5 < 0xfffffffffffffffe) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar5 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ACEScg_to_linear_sRGB");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x3ae);
      ::std::operator<<(poVar5," ");
      ::std::__cxx11::string::string
                ((string *)&local_1c8,"channels must be 3 or 4, but got {}",(allocator *)local_200);
      fmt::format<unsigned_long>((string *)(local_200 + 8),&local_1c8,&local_1d8);
      poVar5 = ::std::operator<<((ostream *)local_1a8,(string *)(local_200 + 8));
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      goto LAB_0034c1ca;
    }
    if (out_img != (vector<float,_std::allocator<float>_> *)0x0) {
      __new_size = (pointer)((long)(in_img->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(in_img->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 2);
      pcVar8 = (pointer)(height * width * channels);
      local_208 = err;
      if (__new_size == pcVar8) {
        ::std::vector<float,_std::allocator<float>_>::resize(out_img,(size_type)__new_size);
        pfVar6 = (in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar7 = (out_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (channels == 3) {
          pfVar7 = pfVar7 + 2;
          pfVar6 = pfVar6 + 2;
          for (sVar9 = 0; sVar9 != height; sVar9 = sVar9 + 1) {
            lVar11 = 0;
            sVar12 = width;
            while (bVar13 = sVar12 != 0, sVar12 = sVar12 - 1, bVar13) {
              fVar1 = *(float *)((long)pfVar6 + lVar11);
              uVar3 = *(undefined8 *)((long)pfVar6 + lVar11 + -8);
              fVar15 = (float)uVar3;
              fVar16 = (float)((ulong)uVar3 >> 0x20);
              fVar17 = fVar16 * 0.621792;
              fVar18 = fVar1 * 1.152972 + (fVar15 * -0.024004 - fVar16 * 0.128969);
              fVar16 = 0.0;
              if (0.0 <= fVar18) {
                fVar16 = fVar18;
              }
              auVar4._4_4_ = fVar15 * -0.130257 + fVar1 * -0.012033211;
              auVar4._0_4_ = (fVar15 * 1.705052 - fVar17) + fVar1 * -0.083258;
              auVar4._8_4_ = (0.0 - fVar17) + fVar1 * 0.0;
              auVar4._12_4_ = (0.0 - fVar17) + fVar1 * 0.0;
              auVar14 = maxps(ZEXT816(0),auVar4);
              *(long *)((long)pfVar7 + lVar11 + -8) = auVar14._0_8_;
              *(float *)((long)pfVar7 + lVar11) = fVar16;
              lVar11 = lVar11 + 0xc;
            }
            pfVar7 = pfVar7 + width * 3;
            pfVar6 = pfVar6 + width * 3;
          }
        }
        else {
          pfVar7 = pfVar7 + 3;
          pfVar6 = pfVar6 + 3;
          for (sVar9 = 0; sVar9 != height; sVar9 = sVar9 + 1) {
            lVar11 = 0;
            sVar12 = width;
            while (bVar13 = sVar12 != 0, sVar12 = sVar12 - 1, bVar13) {
              fVar1 = *(float *)((long)pfVar6 + lVar11 + -4);
              uVar2 = *(undefined4 *)((long)pfVar6 + lVar11);
              uVar3 = *(undefined8 *)((long)pfVar6 + lVar11 + -0xc);
              fVar15 = (float)uVar3;
              fVar16 = (float)((ulong)uVar3 >> 0x20);
              fVar17 = fVar16 * 0.621792;
              fVar18 = fVar1 * 1.152972 + (fVar15 * -0.024004 - fVar16 * 0.128969);
              fVar16 = 0.0;
              if (0.0 <= fVar18) {
                fVar16 = fVar18;
              }
              auVar14._4_4_ = fVar15 * -0.130257 + fVar1 * -0.012033211;
              auVar14._0_4_ = (fVar15 * 1.705052 - fVar17) + fVar1 * -0.083258;
              auVar14._8_4_ = (0.0 - fVar17) + fVar1 * 0.0;
              auVar14._12_4_ = (0.0 - fVar17) + fVar1 * 0.0;
              auVar14 = maxps(ZEXT816(0),auVar14);
              *(long *)((long)pfVar7 + lVar11 + -0xc) = auVar14._0_8_;
              *(float *)((long)pfVar7 + lVar11 + -4) = fVar16;
              *(undefined4 *)((long)pfVar7 + lVar11) = uVar2;
              lVar11 = lVar11 + 0x10;
            }
            pfVar7 = pfVar7 + width * 4;
            pfVar6 = pfVar6 + width * 4;
          }
        }
        return true;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar5 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ACEScg_to_linear_sRGB");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x3b7);
      ::std::operator<<(poVar5," ");
      ::std::__cxx11::string::string
                ((string *)&local_1c8,"Input buffer size must be {}, but got {}",&local_209);
      local_1d0 = (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2;
      local_200._0_8_ = pcVar8;
      fmt::format<unsigned_long,unsigned_long>
                ((string *)(local_200 + 8),(fmt *)&local_1c8,(string *)local_200,&local_1d0,
                 (unsigned_long *)out_img);
      poVar5 = ::std::operator<<((ostream *)local_1a8,(string *)(local_200 + 8));
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      err = local_208;
      goto LAB_0034c1ca;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar5 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ACEScg_to_linear_sRGB");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x3b2);
    ::std::operator<<(poVar5," ");
    pcVar10 = "`out_img` is nullptr.";
  }
  poVar5 = ::std::operator<<((ostream *)local_1a8,pcVar10);
  ::std::operator<<(poVar5,"\n");
LAB_0034c1ca:
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return false;
}

Assistant:

bool ACEScg_to_linear_sRGB(const std::vector<float> &in_img, size_t width,
                         size_t height, size_t channels,
                         std::vector<float> *out_img, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if ((channels != 3) && (channels != 4)) {
    PUSH_ERROR_AND_RETURN(fmt::format("channels must be 3 or 4, but got {}", channels));
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }


  if (in_img.size() != (width * height * channels)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Input buffer size must be {}, but got {}", (width * height * channels), in_img.size()));
  }

  out_img->resize(in_img.size());

  // inv(ACEScg_to_lin_sRGB)
  // 
  // https://www.shadertoy.com/view/WltSRB

  if (channels == 3) {
    for (size_t y = 0; y < height; y++) {
      for (size_t x = 0; x < width; x++) {
        float r, g, b;
        r = in_img[3 * (y * width + x) + 0];
        g = in_img[3 * (y * width + x) + 1];
        b = in_img[3 * (y * width + x) + 2];

        float out_rgb[3];
        out_rgb[0] =  1.705052f * r -0.621792f * g   -0.083258f * b;
        out_rgb[1] = -0.130257f * r + 1.140805f *  -0.010548f * b;
        out_rgb[2] = -0.024004f * r -0.128969f *g + 1.152972f * b;

        // clamp negative
        out_rgb[0] = (out_rgb[0] < 0.0f) ? 0.0f : out_rgb[0];
        out_rgb[1] = (out_rgb[1] < 0.0f) ? 0.0f : out_rgb[1];
        out_rgb[2] = (out_rgb[2] < 0.0f) ? 0.0f : out_rgb[2];

        (*out_img)[3 * (y * width + x) + 0] = out_rgb[0];
        (*out_img)[3 * (y * width + x) + 1] = out_rgb[1];
        (*out_img)[3 * (y * width + x) + 2] = out_rgb[2];
      }
    }

  } else { // rgba
    for (size_t y = 0; y < height; y++) {
      for (size_t x = 0; x < width; x++) {
        float r, g, b, a;
        r = in_img[4 * (y * width + x) + 0];
        g = in_img[4 * (y * width + x) + 1];
        b = in_img[4 * (y * width + x) + 2];
        a = in_img[4 * (y * width + x) + 3];

        float out_rgb[3];
        out_rgb[0] =  1.705052f * r -0.621792f * g   -0.083258f * b;
        out_rgb[1] = -0.130257f * r + 1.140805f *  -0.010548f * b;
        out_rgb[2] = -0.024004f * r -0.128969f *g + 1.152972f * b;

        // clamp negative value
        out_rgb[0] = (out_rgb[0] < 0.0f) ? 0.0f : out_rgb[0];
        out_rgb[1] = (out_rgb[1] < 0.0f) ? 0.0f : out_rgb[1];
        out_rgb[2] = (out_rgb[2] < 0.0f) ? 0.0f : out_rgb[2];

        (*out_img)[4 * (y * width + x) + 0] = out_rgb[0];
        (*out_img)[4 * (y * width + x) + 1] = out_rgb[1];
        (*out_img)[4 * (y * width + x) + 2] = out_rgb[2];
        (*out_img)[4 * (y * width + x) + 3] = a;
      }
    }
  }

  return true;
}